

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectMatrix.hpp
# Opt level: O2

void __thiscall OpenMD::RectMatrix<double,_3U,_3U>::mul(RectMatrix<double,_3U,_3U> *this,double s)

{
  uint i;
  long lVar1;
  uint j;
  long lVar2;
  
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      (*(double (*) [3])*(double (*) [3])this)[lVar2] =
           (*(double (*) [3])*(double (*) [3])this)[lVar2] * s;
    }
    this = (RectMatrix<double,_3U,_3U> *)((long)this + 0x18);
  }
  return;
}

Assistant:

inline void mul(Real s) {
      for (unsigned int i = 0; i < Row; i++)
        for (unsigned int j = 0; j < Col; j++)
          this->data_[i][j] *= s;
    }